

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

void __thiscall FIX::Session::generateHeartbeat(Session *this,Message *testRequest)

{
  FieldBase *field;
  allocator<char> local_1e1;
  STRING local_1e0;
  FieldBase local_1c0;
  Message heartbeat;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"0",&local_1e1);
  MsgType::MsgType((MsgType *)&local_1c0,&local_1e0);
  newMessage(&heartbeat,this,(MsgType *)&local_1c0);
  FieldBase::~FieldBase(&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  fill(this,&heartbeat.m_header);
  field = (FieldBase *)FieldMap::getField<FIX::TestReqID>(&testRequest->super_FieldMap);
  FieldMap::setField(&heartbeat.super_FieldMap,field,true);
  sendRaw(this,&heartbeat,0);
  Message::~Message(&heartbeat);
  return;
}

Assistant:

void Session::generateHeartbeat(const Message &testRequest) {
  Message heartbeat = newMessage(MsgType(MsgType_Heartbeat));

  fill(heartbeat.getHeader());
  try {
    heartbeat.setField(testRequest.getField<TestReqID>());
  } catch (FieldNotFound &) {}

  sendRaw(heartbeat);
}